

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_GIF.cpp
# Opt level: O3

int __thiscall Am_GIF_Image::process_gif(Am_GIF_Image *this,ifstream *ifs,GIF_Load_Info *gli)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ushort uVar13;
  unsigned_short input_code;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ushort uVar17;
  uint uVar18;
  short j;
  ushort uVar19;
  ushort uVar20;
  bool bVar21;
  bool bVar22;
  uchar buf [256];
  unsigned_short stack [4096];
  unsigned_short suffix [4096];
  unsigned_short prefix [4096];
  ushort local_61a4;
  uint local_61a0;
  uint local_619c;
  ushort local_6198;
  ushort local_6174;
  byte local_6138 [256];
  ushort local_6038 [4096];
  ushort auStack_4038 [4096];
  ushort auStack_2038 [4100];
  
  iVar2 = (this->super_Am_Generic_Image).iminfo.num_colors;
  gli->x = 0;
  gli->y = 0;
  uVar4 = std::istream::get();
  iVar5 = 0;
  if (0xfffffff8 < uVar4 - 9) {
    uVar18 = 1 << ((byte)uVar4 & 0x1f);
    uVar4 = uVar4 + 1;
    uVar14 = 1 << ((byte)uVar4 & 0x1f);
    std::ios::clear((int)*(undefined8 *)(*(long *)ifs + -0x18) + (int)ifs);
    uVar6 = std::istream::get();
    uVar6 = uVar6 & 0xffff;
    if (uVar6 != 0) {
      uVar1 = iVar2 - 1;
      uVar16 = 0;
      uVar13 = 0;
      local_61a0 = uVar14 - 1;
      local_619c = uVar18 + 1;
      uVar3 = uVar14;
      uVar9 = uVar18 + 2;
      uVar15 = uVar14;
      uVar20 = uVar4;
      do {
        std::istream::read((char *)ifs,(long)local_6138);
        if (((byte)ifs[*(long *)(*(long *)ifs + -0x18) + 0x20] & 5) != 0) {
          return 0;
        }
        uVar12 = 0;
        uVar8 = uVar15;
        do {
          uVar16 = (ulong)local_6138[uVar12] << ((byte)uVar13 & 0x3f) | uVar16;
          uVar13 = uVar13 + 8;
          uVar15 = uVar8;
          if (uVar20 <= uVar13) {
            do {
              while( true ) {
                uVar19 = uVar20;
                uVar17 = uVar13;
                uVar15 = local_61a0 & (uint)uVar16;
                uVar16 = uVar16 >> ((byte)uVar19 & 0x3f);
                local_6174 = (ushort)(uVar18 + 1);
                uVar13 = (ushort)uVar15;
                if (uVar13 == local_6174) goto LAB_0019fa11;
                if (uVar18 != (uVar15 & 0xffff)) break;
                local_61a0 = uVar14 - 1;
                uVar9 = uVar18 + 2;
                uVar3 = uVar14;
                uVar8 = 0xffff;
                uVar20 = uVar4;
LAB_0019f9c1:
                uVar15 = uVar8;
                uVar13 = uVar17 - uVar19;
                if ((ushort)(uVar17 - uVar19) < uVar20) goto LAB_0019f9e1;
              }
              if ((short)uVar8 != -1) {
                local_6198 = (ushort)uVar9;
                uVar7 = uVar15;
                if (local_6198 <= uVar13) {
                  local_6038[0] = (ushort)(byte)local_619c;
                  uVar7 = uVar8;
                }
                uVar10 = (ulong)(local_6198 <= uVar13);
                local_61a4 = (ushort)uVar1;
                uVar13 = (ushort)uVar7;
                while (local_61a4 < uVar13) {
                  if (0xfff < (uVar7 & 0xffff)) {
                    return 0;
                  }
                  if (0xffd < uVar10) {
                    return 0;
                  }
                  uVar11 = (ulong)((uVar7 & 0xffff) * 2);
                  local_6038[uVar10] = *(ushort *)((long)auStack_4038 + uVar11);
                  uVar10 = uVar10 + 1;
                  uVar13 = *(ushort *)((long)auStack_2038 + uVar11);
                  uVar7 = (uint)uVar13;
                }
                local_619c = uVar7 & uVar1;
                uVar13 = (ushort)local_619c & 0xff;
                uVar10 = uVar10 & 0xffff;
                local_6038[uVar10] = uVar13;
                do {
                  add_to_image(this,gli,local_6038[uVar10]);
                  bVar21 = uVar10 != 0;
                  uVar10 = uVar10 - 1;
                } while (bVar21);
                uVar10 = (ulong)((uVar9 & 0xffff) * 2);
                *(short *)((long)auStack_2038 + uVar10) = (short)uVar8;
                *(ushort *)((long)auStack_4038 + uVar10) = uVar13;
                uVar9 = uVar9 + 1;
                bVar21 = (ushort)uVar3 <= (ushort)uVar9;
                bVar22 = uVar19 < 0xc;
                iVar2 = uVar3 * 2;
                uVar8 = uVar3 * 2;
                if (!bVar22 || !bVar21) {
                  uVar8 = uVar3;
                }
                uVar20 = uVar19 + (bVar22 && bVar21);
                uVar3 = uVar8;
                uVar8 = uVar15;
                if (bVar22 && bVar21) {
                  local_61a0 = iVar2 - 1;
                }
                goto LAB_0019f9c1;
              }
              local_619c = uVar15 & uVar1;
              add_to_image(this,gli,(unsigned_short)local_619c);
              uVar8 = uVar15;
              uVar13 = uVar17 - uVar19;
              uVar20 = uVar19;
            } while (uVar19 <= (ushort)(uVar17 - uVar19));
LAB_0019f9e1:
            uVar13 = uVar17 - uVar19;
          }
          uVar12 = uVar12 + 1;
          uVar8 = uVar15;
        } while (uVar12 != uVar6);
        uVar6 = std::istream::get();
        uVar6 = uVar6 & 0xffff;
      } while (uVar6 != 0);
    }
LAB_0019fa11:
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int
Am_GIF_Image::process_gif(std::ifstream &ifs, GIF_Load_Info &gli)
{
  // Buffer to hold a block of image data from the GIF file.
  unsigned char buf[256];
  unsigned short data_mask = iminfo.num_colors - 1;

  unsigned short prefix[GIF_TBLSIZE];
  unsigned short suffix[GIF_TBLSIZE];
  unsigned short stack[GIF_TBLSIZE];

  unsigned short istk = 0;

  gli.x = 0;
  gli.y = 0; // initial values

  // Next byte is the initial number of bits used for LZW codes
  unsigned short init_code_size = ifs.get();

  if (init_code_size < 2 || init_code_size > 8) {
    return 0;
  }

  unsigned short clear_code = 1 << init_code_size;
  unsigned short eoi_code = clear_code + 1;
  unsigned short free_code = clear_code + 2;

  // The GIF specification says that, for decompression, the code
  // size should be one bit longer than the initial code size.
  unsigned short code_size = init_code_size + 1;

  // Bit mask needed to extract data bits corresponding to the
  // code size.
  unsigned short max_code = 1 << code_size;
  unsigned short read_mask = max_code - 1;

  ifs.clear();

  unsigned short bitpos = 0;
  unsigned long val = 0;

  for (unsigned short count = ifs.get(); count > 0; count = ifs.get()) {
    // Read a block of data into the buffer
    // ifs.read(buf, count); MSL
    ifs.read((char *)buf, count);
    if (ifs.fail()) {
      return 0;
    }

    // Process the contents of the buffer
    for (unsigned int i = 0; i < count; i++) {
      const unsigned long tmp = buf[i];
      val |= (tmp << bitpos);
      bitpos += 8;

      while (bitpos >= code_size) {
        unsigned short curcode = (unsigned short)(val & read_mask);
        val >>= code_size;
        bitpos -= code_size;
        if (curcode == eoi_code) {
          return 1;
        }
        unsigned short oldcode;
        unsigned short pixel;
        if (curcode == clear_code) {
          free_code = (1 << init_code_size) + 2;
          code_size = init_code_size + 1;
          max_code = 1 << code_size;
          read_mask = max_code - 1;
          istk = 0;
          oldcode = 0xffff;
        } else {
          if (oldcode == 0xffff) {
            // First code, after initialization, is a raw pixel value
            pixel = curcode & data_mask;
            add_to_image(gli, pixel);
            oldcode = curcode;
          } else {
            const unsigned short input_code = curcode;
            if (curcode >= free_code) {
              // Code is not in table yet. Save last character in stack
              stack[istk++] = (unsigned char)pixel;
              curcode = oldcode;
            }
            while (curcode > data_mask) {
              // [eab] I don't know enough about the LZW algorithm
              // to introduce more precise range tests than the following
              // on curcode and istk
              if (curcode >= GIF_TBLSIZE || istk >= GIF_TBLSIZE - 2) {
                return 0; // corrupt GIF
              }
              // Save bytes corresponding to compression code in stack for
              // later use.
              stack[istk++] = suffix[curcode];
              curcode = prefix[curcode];
            }

            pixel = curcode & data_mask;
            stack[istk++] = (unsigned char)pixel;

            // Add decoded string of bytes to image
            for (short j = istk - 1; j >= 0; j--)
              add_to_image(gli, stack[j]);

            istk = 0;

            // Add current information to decompression tables
            prefix[free_code] = oldcode;
            suffix[free_code] = (unsigned char)pixel;
            oldcode = input_code;

            // Adjust code size, if necessary.
            free_code++;
            if (free_code >= max_code) {
              if (code_size < GIF_MAXCODE) {
                code_size++;
                max_code *= 2;
                read_mask = max_code - 1;
              }
            }
          }
        }
      }
    }
  }
  return 1;
}